

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  double gt_y;
  result_type rVar2;
  result_type rVar3;
  bool bVar4;
  clock_t cVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  ulong uVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  double *pdVar13;
  clock_t cVar14;
  double runtime;
  int stop;
  int j_1;
  double *avg_error;
  undefined1 local_4f0 [4];
  int i_1;
  Particle best_particle;
  double highest_weight;
  undefined1 local_4b8 [4];
  int num_particles;
  vector<Particle,_std::allocator<Particle>_> particles;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_488;
  int local_46c;
  undefined1 auStack_468 [4];
  int j;
  LandmarkObs obs;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> noisy_observations;
  undefined1 local_418 [8];
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations;
  ostringstream local_3f8 [8];
  ostringstream file;
  int local_27c;
  double dStack_278;
  int i;
  double cum_mean_error [3];
  double local_258;
  double total_error [3];
  ParticleFilter pf;
  int num_time_steps;
  undefined1 local_1e0 [8];
  vector<ground_truth,_std::allocator<ground_truth>_> gt;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  vector<control_s,_std::allocator<control_s>_> position_meas;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [8];
  Map map;
  double n_heading;
  double n_range;
  double n_theta;
  double n_y;
  double n_x;
  normal_distribution<double> N_obs_y;
  normal_distribution<double> N_obs_x;
  normal_distribution<double> N_theta_init;
  normal_distribution<double> N_y_init;
  normal_distribution<double> N_x_init;
  default_random_engine gen;
  double sigma_landmark [2];
  double sigma_pos [3];
  double sensor_range;
  double delta_t;
  int start;
  double max_yaw_error;
  double max_translation_error;
  double max_runtime;
  int time_steps_before_lock_required;
  
  max_runtime._4_4_ = 0;
  cVar5 = clock();
  sigma_landmark[1] = 0.3;
  gen._M_x = 0x3fd3333333333333;
  sigma_landmark[0] = 0.3;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &N_x_init._M_saved_available);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&N_y_init._M_saved_available,0.0,sigma_landmark[1]);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&N_theta_init._M_saved_available,0.0,0.3);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&N_obs_x._M_saved_available,0.0,0.01);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&N_obs_y._M_saved_available,0.0,(result_type)gen._M_x);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)&n_x,0.0,sigma_landmark[0]);
  Map::Map((Map *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"data/map_data.txt",&local_171);
  bVar4 = read_map_data((string *)local_170,(Map *)local_150);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Error: Could not open map file");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    max_runtime._4_4_ = -1;
    position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0010e7f8;
  }
  std::vector<control_s,_std::allocator<control_s>_>::vector
            ((vector<control_s,_std::allocator<control_s>_> *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,"data/control_data.txt",
             (allocator *)
             ((long)&gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  bVar4 = read_control_data((string *)local_1c0,
                            (vector<control_s,_std::allocator<control_s>_> *)local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gt.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::vector<ground_truth,_std::allocator<ground_truth>_>::vector
              ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&num_time_steps,"data/gt_data.txt",
               (allocator *)
               ((long)&pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar4 = read_gt_data((string *)&num_time_steps,
                         (vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0);
    std::__cxx11::string::~string((string *)&num_time_steps);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      sVar6 = std::vector<control_s,_std::allocator<control_s>_>::size
                        ((vector<control_s,_std::allocator<control_s>_> *)local_1a0);
      pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar6;
      ParticleFilter::ParticleFilter((ParticleFilter *)(total_error + 2));
      memset(&local_258,0,0x18);
      memset(&stack0xfffffffffffffd88,0,0x18);
      for (local_27c = 0;
          local_27c <
          (int)pf.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; local_27c = local_27c + 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Time step: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream(local_3f8);
        poVar7 = std::operator<<((ostream *)local_3f8,"data/observation/observations_");
        observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,observations.
                                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
        observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = std::setw(6);
        poVar7 = std::operator<<(poVar7,observations.
                                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c + 1);
        std::operator<<(poVar7,".txt");
        std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                  ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_418);
        std::__cxx11::ostringstream::str();
        bVar4 = read_landmark_data((string *)
                                   &noisy_observations.
                                    super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_418);
        std::__cxx11::string::~string
                  ((string *)
                   &noisy_observations.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          bVar4 = ParticleFilter::initialized((ParticleFilter *)(total_error + 2));
          if (bVar4) {
            pvVar8 = std::vector<control_s,_std::allocator<control_s>_>::operator[]
                               ((vector<control_s,_std::allocator<control_s>_> *)local_1a0,
                                (long)(local_27c + -1));
            dVar1 = pvVar8->velocity;
            pvVar8 = std::vector<control_s,_std::allocator<control_s>_>::operator[]
                               ((vector<control_s,_std::allocator<control_s>_> *)local_1a0,
                                (long)(local_27c + -1));
            ParticleFilter::prediction
                      ((ParticleFilter *)(total_error + 2),0.1,sigma_landmark + 1,dVar1,
                       pvVar8->yawrate);
          }
          else {
            std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&N_y_init._M_saved_available,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &N_x_init._M_saved_available);
            std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&N_theta_init._M_saved_available,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &N_x_init._M_saved_available);
            std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)&N_obs_x._M_saved_available,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &N_x_init._M_saved_available);
            std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                      ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                       (long)local_27c);
            std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                      ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                       (long)local_27c);
            std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                      ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                       (long)local_27c);
            ParticleFilter::init
                      ((ParticleFilter *)(total_error + 2),(EVP_PKEY_CTX *)(sigma_landmark + 1));
          }
          std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                    ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&obs.y);
          for (local_46c = 0; uVar9 = (ulong)local_46c,
              sVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size
                                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_418),
              uVar9 < sVar6; local_46c = local_46c + 1) {
            rVar2 = std::normal_distribution<double>::operator()
                              ((normal_distribution<double> *)&N_obs_y._M_saved_available,
                               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                *)&N_x_init._M_saved_available);
            rVar3 = std::normal_distribution<double>::operator()
                              ((normal_distribution<double> *)&n_x,
                               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                *)&N_x_init._M_saved_available);
            pvVar10 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_418,
                                 (long)local_46c);
            auStack_468 = pvVar10->id;
            unique0x10000ee2 = *(undefined4 *)&pvVar10->field_0x4;
            obs._0_8_ = pvVar10->x + rVar2;
            obs.x = pvVar10->y + rVar3;
            std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                      ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&obs.y,
                       (value_type *)auStack_468);
          }
          std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
                    (&local_488,(vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&obs.y);
          Map::Map((Map *)&particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(Map *)local_150);
          ParticleFilter::updateWeights
                    ((ParticleFilter *)(total_error + 2),50.0,(double *)&gen,&local_488,
                     (Map *)&particles.super__Vector_base<Particle,_std::allocator<Particle>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          Map::~Map((Map *)&particles.super__Vector_base<Particle,_std::allocator<Particle>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector(&local_488);
          ParticleFilter::resample((ParticleFilter *)(total_error + 2));
          std::vector<Particle,_std::allocator<Particle>_>::vector
                    ((vector<Particle,_std::allocator<Particle>_> *)local_4b8,
                     (vector<Particle,_std::allocator<Particle>_> *)
                     &pf.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          sVar6 = std::vector<Particle,_std::allocator<Particle>_>::size
                            ((vector<Particle,_std::allocator<Particle>_> *)local_4b8);
          best_particle.weight = 0.0;
          for (avg_error._4_4_ = 0; avg_error._4_4_ < (int)sVar6;
              avg_error._4_4_ = avg_error._4_4_ + 1) {
            pvVar11 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                                ((vector<Particle,_std::allocator<Particle>_> *)local_4b8,
                                 (long)avg_error._4_4_);
            if (best_particle.weight < pvVar11->weight) {
              pvVar11 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                                  ((vector<Particle,_std::allocator<Particle>_> *)local_4b8,
                                   (long)avg_error._4_4_);
              best_particle.weight = pvVar11->weight;
              pvVar11 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                                  ((vector<Particle,_std::allocator<Particle>_> *)local_4b8,
                                   (long)avg_error._4_4_);
              memcpy(local_4f0,pvVar11,0x28);
            }
          }
          pvVar12 = std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                              ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                               (long)local_27c);
          dVar1 = pvVar12->x;
          pvVar12 = std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                              ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                               (long)local_27c);
          gt_y = pvVar12->y;
          pvVar12 = std::vector<ground_truth,_std::allocator<ground_truth>_>::operator[]
                              ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0,
                               (long)local_27c);
          pdVar13 = getError(dVar1,gt_y,pvVar12->theta,(double)best_particle._0_8_,best_particle.x,
                             best_particle.y);
          for (runtime._4_4_ = 0; runtime._4_4_ < 3; runtime._4_4_ = runtime._4_4_ + 1) {
            total_error[(long)runtime._4_4_ + -1] =
                 pdVar13[runtime._4_4_] + total_error[(long)runtime._4_4_ + -1];
            *(double *)((long)&stack0xfffffffffffffd88 + (long)runtime._4_4_ * 8) =
                 total_error[(long)runtime._4_4_ + -1] / (double)(local_27c + 1);
          }
          poVar7 = std::operator<<((ostream *)&std::cout,"Cumulative mean weighted error: x ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,dStack_278);
          poVar7 = std::operator<<(poVar7," y ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,cum_mean_error[0]);
          poVar7 = std::operator<<(poVar7," yaw ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,cum_mean_error[1]);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          if ((local_27c < 100) ||
             (((dStack_278 <= 1.0 && (cum_mean_error[0] <= 1.0)) && (cum_mean_error[1] <= 0.05)))) {
            position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          else {
            if (dStack_278 <= 1.0) {
              if (cum_mean_error[0] <= 1.0) {
                poVar7 = std::operator<<((ostream *)&std::cout,"Your yaw error, ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,cum_mean_error[1]);
                poVar7 = std::operator<<(poVar7," is larger than the maximum allowable error, ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,0.05);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cout,"Your y error, ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,cum_mean_error[0]);
                poVar7 = std::operator<<(poVar7," is larger than the maximum allowable error, ");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,1.0);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cout,"Your x error, ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,dStack_278);
              poVar7 = std::operator<<(poVar7," is larger than the maximum allowable error, ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,1.0);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            max_runtime._4_4_ = -1;
            position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          std::vector<Particle,_std::allocator<Particle>_>::~vector
                    ((vector<Particle,_std::allocator<Particle>_> *)local_4b8);
          std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
                    ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&obs.y);
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,"Error: Could not open observation file ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_27c + 1);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          max_runtime._4_4_ = -1;
          position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
                  ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)local_418);
        std::__cxx11::ostringstream::~ostringstream(local_3f8);
        if ((int)position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) goto LAB_0010e7a4;
      }
      cVar14 = clock();
      dVar1 = (double)((int)cVar14 - (int)cVar5) / 1000000.0;
      poVar7 = std::operator<<((ostream *)&std::cout,"Runtime (sec): ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar1);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if ((45.0 <= dVar1) ||
         (bVar4 = ParticleFilter::initialized((ParticleFilter *)(total_error + 2)), !bVar4)) {
        bVar4 = ParticleFilter::initialized((ParticleFilter *)(total_error + 2));
        if (!bVar4) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "This is the starter code. You haven\'t initialized your filter."
                                  );
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          goto LAB_0010e793;
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Your runtime ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar1);
        poVar7 = std::operator<<(poVar7," is larger than the maximum allowable runtime, ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,45.0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        max_runtime._4_4_ = -1;
        position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"Success! Your particle filter passed!");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
LAB_0010e793:
        max_runtime._4_4_ = 0;
        position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
LAB_0010e7a4:
      ParticleFilter::~ParticleFilter((ParticleFilter *)(total_error + 2));
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"Error: Could not open ground truth data file")
      ;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      max_runtime._4_4_ = -1;
      position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::vector<ground_truth,_std::allocator<ground_truth>_>::~vector
              ((vector<ground_truth,_std::allocator<ground_truth>_> *)local_1e0);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "Error: Could not open position/control measurement file");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    max_runtime._4_4_ = -1;
    position_meas.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::vector<control_s,_std::allocator<control_s>_>::~vector
            ((vector<control_s,_std::allocator<control_s>_> *)local_1a0);
LAB_0010e7f8:
  Map::~Map((Map *)local_150);
  return max_runtime._4_4_;
}

Assistant:

int main() {
	
	// parameters related to grading.
	int time_steps_before_lock_required = 100; // number of time steps before accuracy is checked by grader.
	double max_runtime = 45; // Max allowable runtime to pass [sec]
	double max_translation_error = 1; // Max allowable translation error to pass [m]
	double max_yaw_error = 0.05; // Max allowable yaw error [rad]



	// Start timer.
	int start = clock();
	
	//Set up parameters here
	double delta_t = 0.1; // Time elapsed between measurements [sec]
	double sensor_range = 50; // Sensor range [m]
	
	/*
	 * Sigmas - just an estimate, usually comes from uncertainty of sensor, but
	 * if you used fused data from multiple sensors, it's difficult to find
	 * these uncertainties directly.
	 */
	double sigma_pos [3] = {0.3, 0.3, 0.01}; // GPS measurement uncertainty [x [m], y [m], theta [rad]]
	double sigma_landmark [2] = {0.3, 0.3}; // Landmark measurement uncertainty [x [m], y [m]]

	// noise generation
	default_random_engine gen;
	normal_distribution<double> N_x_init(0, sigma_pos[0]);
	normal_distribution<double> N_y_init(0, sigma_pos[1]);
	normal_distribution<double> N_theta_init(0, sigma_pos[2]);
	normal_distribution<double> N_obs_x(0, sigma_landmark[0]);
	normal_distribution<double> N_obs_y(0, sigma_landmark[1]);
	double n_x, n_y, n_theta, n_range, n_heading;
	// Read map data
	Map map;
	if (!read_map_data("data/map_data.txt", map)) {
		cout << "Error: Could not open map file" << endl;
		return -1;
	}

	// Read position data
	vector<control_s> position_meas;
	if (!read_control_data("data/control_data.txt", position_meas)) {
		cout << "Error: Could not open position/control measurement file" << endl;
		return -1;
	}
	
	// Read ground truth data
	vector<ground_truth> gt;
	if (!read_gt_data("data/gt_data.txt", gt)) {
		cout << "Error: Could not open ground truth data file" << endl;
		return -1;
	}
	
	// Run particle filter!
	int num_time_steps = position_meas.size();
	ParticleFilter pf;
	double total_error[3] = {0,0,0};
	double cum_mean_error[3] = {0,0,0};
	
	for (int i = 0; i < num_time_steps; ++i) {
		cout << "Time step: " << i << endl;
		// Read in landmark observations for current time step.
		ostringstream file;
		file << "data/observation/observations_" << setfill('0') << setw(6) << i+1 << ".txt";
		vector<LandmarkObs> observations;
		if (!read_landmark_data(file.str(), observations)) {
			cout << "Error: Could not open observation file " << i+1 << endl;
			return -1;
		}
		
		// Initialize particle filter if this is the first time step.
		if (!pf.initialized()) {
			n_x = N_x_init(gen);
			n_y = N_y_init(gen);
			n_theta = N_theta_init(gen);
			pf.init(gt[i].x + n_x, gt[i].y + n_y, gt[i].theta + n_theta, sigma_pos);
		}
		else {
			// Predict the vehicle's next state (noiseless).
			pf.prediction(delta_t, sigma_pos, position_meas[i-1].velocity, position_meas[i-1].yawrate);
		}
		// simulate the addition of noise to noiseless observation data.
		vector<LandmarkObs> noisy_observations;
		LandmarkObs obs;
		for (int j = 0; j < observations.size(); ++j) {
			n_x = N_obs_x(gen);
			n_y = N_obs_y(gen);
			obs = observations[j];
			obs.x = obs.x + n_x;
			obs.y = obs.y + n_y;
			noisy_observations.push_back(obs);
		}

		// Update the weights and resample
		pf.updateWeights(sensor_range, sigma_landmark, noisy_observations, map);
		pf.resample();
		
		// Calculate and output the average weighted error of the particle filter over all time steps so far.
		vector<Particle> particles = pf.particles;
		int num_particles = particles.size();
		double highest_weight = 0.0;
		Particle best_particle;
		for (int i = 0; i < num_particles; ++i) {
			if (particles[i].weight > highest_weight) {
				highest_weight = particles[i].weight;
				best_particle = particles[i];
			}
		}
		double *avg_error = getError(gt[i].x, gt[i].y, gt[i].theta, best_particle.x, best_particle.y, best_particle.theta);

		for (int j = 0; j < 3; ++j) {
			total_error[j] += avg_error[j];
			cum_mean_error[j] = total_error[j] / (double)(i + 1);
		}
		
		// Print the cumulative weighted error
		cout << "Cumulative mean weighted error: x " << cum_mean_error[0] << " y " << cum_mean_error[1] << " yaw " << cum_mean_error[2] << endl;
		
		// If the error is too high, say so and then exit.
		if (i >= time_steps_before_lock_required) {
			if (cum_mean_error[0] > max_translation_error || cum_mean_error[1] > max_translation_error || cum_mean_error[2] > max_yaw_error) {
				if (cum_mean_error[0] > max_translation_error) {
					cout << "Your x error, " << cum_mean_error[0] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else if (cum_mean_error[1] > max_translation_error) {
					cout << "Your y error, " << cum_mean_error[1] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else {
					cout << "Your yaw error, " << cum_mean_error[2] << " is larger than the maximum allowable error, " << max_yaw_error << endl;
				}
				return -1;
			}
		}
	}
	
	// Output the runtime for the filter.
	int stop = clock();
	double runtime = (stop - start) / double(CLOCKS_PER_SEC);
	cout << "Runtime (sec): " << runtime << endl;
	
	// Print success if accuracy and runtime are sufficient (and this isn't just the starter code).
	if (runtime < max_runtime && pf.initialized()) {
		cout << "Success! Your particle filter passed!" << endl;
	}
	else if (!pf.initialized()) {
		cout << "This is the starter code. You haven't initialized your filter." << endl;
	}
	else {
		cout << "Your runtime " << runtime << " is larger than the maximum allowable runtime, " << max_runtime << endl;
		return -1;
	}
	
	return 0;
}